

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddWarning
          (ErrorPrinter *this,string *filename,int line,int column,string *message)

{
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"warning",&local_51);
  AddErrorOrWarning(this,filename,line,column,message,&local_50,(ostream *)&std::clog);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void AddWarning(const string& filename, int line, int column,
                  const string& message) {
    AddErrorOrWarning(filename, line, column, message, "warning", std::clog);
  }